

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void valid_option(int argc,char **argv,char *in_path,char *out_path,float *sigma1,float *sigma2,
                 int *histo,int *sf,float *trsh,char *i_fname,char *v_fname,char *c_fname,
                 char *h_fname,int *nbin,float *incr,int *n_frame,float *alpha,float *delta,
                 int *iter,int *binary,int *row,int *col,int *horn,int *vmag,float *maxv)

{
  int iVar1;
  param512_t *papVar2;
  ulong uVar3;
  char *s1;
  int iVar4;
  int iVar5;
  qnode_ptr_t ptVar6;
  long lVar7;
  long lVar8;
  FILE *__stream;
  int *piVar9;
  int extraout_EDX;
  int iVar10;
  float *pfVar11;
  qnode_ptr_t extraout_RDX;
  uint uVar12;
  float *unaff_RBX;
  ulong uVar13;
  uint uVar14;
  char **unaff_RBP;
  long lVar15;
  char *pcVar16;
  qnode_ptr_t q;
  undefined4 in_register_0000003c;
  char *pcVar17;
  qnode_ptr_t c;
  int iVar18;
  char *unaff_R13;
  long lVar19;
  char **unaff_R14;
  ulong uVar20;
  int y;
  char *unaff_R15;
  ulong uVar21;
  float fVar22;
  double extraout_XMM0_Qa;
  double dVar23;
  float fVar24;
  double dVar25;
  string str_alpha;
  string str_tg;
  string str_sg;
  string str_trsh;
  string t0;
  int iStack_d20;
  int iStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  ulong uStack_cb0;
  int *piStack_ca8;
  double dStack_ca0;
  ulong uStack_c98;
  ulong uStack_c90;
  code *pcStack_c88;
  char **ppcStack_c80;
  undefined8 uStack_c78;
  double dStack_c70;
  float fStack_c68;
  float fStack_c64;
  float *pfStack_c60;
  ulong uStack_c58;
  disp_field512_t *padStack_c50;
  float fStack_c44;
  float *pfStack_c40;
  long lStack_c38;
  float *pfStack_c30;
  qnode_ptr_t ptStack_c28;
  float afStack_c20 [2];
  int aiStack_c18 [298];
  float afStack_770 [2];
  int aiStack_768 [300];
  float *pfStack_2b8;
  ulong uStack_2b0;
  int *piStack_2a8;
  char **ppcStack_2a0;
  int *piStack_298;
  char **ppcStack_290;
  char *local_288;
  float *local_280;
  float *local_278;
  char *local_270;
  char local_268 [80];
  int local_218 [20];
  int local_1c8 [20];
  int local_178 [20];
  int local_128 [20];
  int local_d8 [20];
  char local_88 [88];
  
  pcVar17 = (char *)CONCAT44(in_register_0000003c,argc);
  if (argc == 1) {
LAB_00104b8c:
    ppcStack_290 = (char **)0x104b91;
    usage();
  }
  local_288 = out_path;
  local_270 = in_path;
  if (argc - 4U < 0x19) {
    *binary = 0;
    *horn = 0;
    *vmag = 0;
    *sf = 0;
    *histo = 0;
    *trsh = 0.0;
    *maxv = 0.0;
    *sigma1 = 3.0;
    local_128[0] = 0x302e33;
    *sigma2 = 1.5;
    local_178[0] = 0x352e31;
    *iter = 10;
    *alpha = 5.0;
    local_1c8[0] = 0x302e35;
    *delta = 1.0;
    local_218[0] = 0x302e31;
    *n_frame = 0;
    *nbin = 0;
    builtin_strncpy(i_fname,"Undefined",10);
    piVar9 = (int *)0x656e696665646e55;
    uVar12 = 0x65646e55;
    builtin_strncpy(v_fname,"Undefined",10);
    builtin_strncpy(c_fname,"Undefined",10);
    builtin_strncpy(h_fname,"Undefined",10);
    unaff_RBX = maxv;
    unaff_RBP = (char **)iter;
    pcVar16 = (char *)sf;
    pcVar17 = i_fname;
    unaff_R13 = (char *)binary;
    unaff_R15 = (char *)vmag;
    local_280 = sigma2;
    local_278 = sigma1;
    if (4 < argc) {
      unaff_RBX = (float *)0x4;
      unaff_R15 = "-A";
      unaff_R13 = "%f";
      do {
        unaff_RBP = (char **)argv[(long)unaff_RBX];
        ppcStack_290 = (char **)0x10452e;
        iVar4 = strcmp("-A",(char *)unaff_RBP);
        iVar5 = (int)unaff_RBX;
        if (iVar4 == 0) {
          if ((int)(iVar5 + 1U) < argc) {
            unaff_RBP = (char **)(ulong)(iVar5 + 1U);
            ppcStack_290 = (char **)0x104670;
            __isoc99_sscanf(argv[(long)unaff_RBP],"%f",alpha);
            pcVar16 = argv[(long)unaff_RBP];
            pcVar17 = (char *)local_1c8;
            goto LAB_0010467c;
          }
          ppcStack_290 = (char **)0x104b7d;
          valid_option_cold_12();
LAB_00104b7d:
          ppcStack_290 = (char **)0x104b82;
          valid_option_cold_11();
LAB_00104b82:
          ppcStack_290 = (char **)0x104b87;
          valid_option_cold_10();
LAB_00104b87:
          ppcStack_290 = (char **)0x104b8c;
          valid_option_cold_9();
          goto LAB_00104b8c;
        }
        ppcStack_290 = (char **)0x104545;
        iVar4 = strcmp("-F",(char *)unaff_RBP);
        if (iVar4 == 0) {
          if (argc <= (int)(iVar5 + 1U)) goto LAB_00104b7d;
          unaff_RBP = (char **)(ulong)(iVar5 + 1U);
          ppcStack_290 = (char **)0x1046aa;
          __isoc99_sscanf(argv[(long)unaff_RBP],"%f",trsh);
          pcVar16 = argv[(long)unaff_RBP];
          pcVar17 = (char *)local_d8;
          ppcStack_290 = (char **)0x1046bb;
          strcpy(pcVar17,pcVar16);
          *sf = 1;
LAB_0010475c:
          iVar4 = 2;
        }
        else {
          ppcStack_290 = (char **)0x10455c;
          iVar4 = strcmp("-C",(char *)unaff_RBP);
          if (iVar4 == 0) {
            uVar12 = iVar5 + 3;
            unaff_RBP = (char **)(ulong)uVar12;
            if ((int)uVar12 < argc) {
              ppcStack_290 = (char **)0x1046ec;
              strcpy(c_fname,argv[(long)unaff_RBX + 1]);
              ppcStack_290 = (char **)0x104707;
              __isoc99_sscanf(argv[(long)unaff_RBX + 2],"%d",nbin);
              pcVar17 = argv[uVar12];
              pcVar16 = "%f";
              ppcStack_290 = (char **)0x10471f;
              __isoc99_sscanf(pcVar17,"%f",incr);
              *histo = 1;
              iVar4 = 4;
              goto LAB_00104761;
            }
            goto LAB_00104b82;
          }
          ppcStack_290 = (char **)0x104573;
          iVar4 = strcmp("-I",(char *)unaff_RBP);
          if (iVar4 == 0) {
            if ((int)(iVar5 + 1U) < argc) {
              pcVar17 = argv[iVar5 + 1U];
              pcVar16 = "%d";
              pfVar11 = (float *)iter;
              goto LAB_00104755;
            }
            goto LAB_00104b87;
          }
          pcVar17 = "-SG";
          ppcStack_290 = (char **)0x10458a;
          pcVar16 = (char *)unaff_RBP;
          iVar4 = strcmp("-SG",(char *)unaff_RBP);
          uVar12 = (uint)piVar9;
          if (iVar4 == 0) {
            if ((int)(iVar5 + 1U) < argc) {
              unaff_RBP = (char **)(ulong)(iVar5 + 1U);
              ppcStack_290 = (char **)0x104792;
              __isoc99_sscanf(argv[(long)unaff_RBP],"%f",local_278);
              pcVar16 = argv[(long)unaff_RBP];
              pcVar17 = (char *)local_128;
LAB_0010467c:
              ppcStack_290 = (char **)0x104681;
              strcpy(pcVar17,pcVar16);
              goto LAB_0010475c;
            }
            goto LAB_00104b9b;
          }
          pcVar17 = "-TG";
          ppcStack_290 = (char **)0x1045a1;
          pcVar16 = (char *)unaff_RBP;
          iVar4 = strcmp("-TG",(char *)unaff_RBP);
          uVar12 = (uint)piVar9;
          if (iVar4 == 0) {
            if ((int)(iVar5 + 1U) < argc) {
              unaff_RBP = (char **)(ulong)(iVar5 + 1U);
              ppcStack_290 = (char **)0x1047c4;
              __isoc99_sscanf(argv[(long)unaff_RBP],"%f",local_280);
              pcVar16 = argv[(long)unaff_RBP];
              pcVar17 = (char *)local_178;
              goto LAB_0010467c;
            }
            goto LAB_00104ba0;
          }
          pcVar17 = "-M";
          ppcStack_290 = (char **)0x1045b8;
          pcVar16 = (char *)unaff_RBP;
          iVar4 = strcmp("-M",(char *)unaff_RBP);
          uVar12 = (uint)piVar9;
          if (iVar4 == 0) {
            if ((int)(iVar5 + 1U) < argc) {
              pcVar17 = argv[iVar5 + 1U];
              pcVar16 = "%d";
              pfVar11 = (float *)n_frame;
LAB_00104755:
              ppcStack_290 = (char **)0x10475c;
              __isoc99_sscanf(pcVar17,pcVar16,pfVar11);
              goto LAB_0010475c;
            }
            goto LAB_00104ba5;
          }
          pcVar17 = "-B";
          ppcStack_290 = (char **)0x1045cf;
          pcVar16 = (char *)unaff_RBP;
          iVar4 = strcmp("-B",(char *)unaff_RBP);
          uVar12 = (uint)piVar9;
          if (iVar4 == 0) {
            uVar14 = iVar5 + 2;
            unaff_RBP = (char **)(ulong)uVar14;
            if (argc <= (int)uVar14) goto LAB_00104baa;
            ppcStack_290 = (char **)0x104822;
            __isoc99_sscanf(argv[(long)unaff_RBX + 1],"%d",col);
            pcVar17 = argv[uVar14];
            pcVar16 = "%d";
            ppcStack_290 = (char **)0x10483e;
            __isoc99_sscanf(pcVar17,"%d",row);
            *binary = 1;
            iVar4 = 3;
          }
          else {
            pcVar17 = "-H";
            ppcStack_290 = (char **)0x1045e6;
            pcVar16 = (char *)unaff_RBP;
            iVar4 = strcmp("-H",(char *)unaff_RBP);
            if (iVar4 != 0) {
              pcVar17 = "-D";
              ppcStack_290 = (char **)0x1045fd;
              pcVar16 = (char *)unaff_RBP;
              iVar4 = strcmp("-D",(char *)unaff_RBP);
              uVar12 = (uint)piVar9;
              if (iVar4 == 0) {
                if ((int)(iVar5 + 1U) < argc) {
                  unaff_RBP = (char **)(ulong)(iVar5 + 1U);
                  ppcStack_290 = (char **)0x104892;
                  __isoc99_sscanf(argv[(long)unaff_RBP],"%f",delta);
                  pcVar16 = argv[(long)unaff_RBP];
                  pcVar17 = (char *)local_218;
                  goto LAB_0010467c;
                }
                goto LAB_00104bb9;
              }
              pcVar17 = "-V";
              ppcStack_290 = (char **)0x104614;
              pcVar16 = (char *)unaff_RBP;
              iVar4 = strcmp("-V",(char *)unaff_RBP);
              if (iVar4 == 0) {
                if ((int)(iVar5 + 1U) < argc) {
                  *vmag = 1;
                  pcVar17 = argv[iVar5 + 1U];
                  pcVar16 = "%f";
                  piVar9 = vmag;
                  pfVar11 = maxv;
                  goto LAB_00104755;
                }
                goto LAB_00104bb4;
              }
              goto LAB_00104baf;
            }
            *horn = 1;
            iVar4 = 1;
          }
        }
LAB_00104761:
        uVar12 = (uint)piVar9;
        unaff_RBX = (float *)(ulong)(uint)(iVar5 + iVar4);
      } while (iVar5 + iVar4 < argc);
    }
    s1 = local_270;
    if (*nbin < 0x65) {
      ppcStack_290 = (char **)0x1048cc;
      concat(argv[1],"/",local_270);
      ppcStack_290 = (char **)0x1048dc;
      concat(argv[2],"/",local_288);
      ppcStack_290 = (char **)0x1048f3;
      concat(s1,argv[3],i_fname);
      builtin_strncpy(local_268,"-sg",4);
      ppcStack_290 = (char **)0x104911;
      concat(local_268,(char *)local_128,local_268);
      ppcStack_290 = (char **)0x104923;
      concat(local_268,"-tg",local_268);
      ppcStack_290 = (char **)0x104936;
      concat(local_268,(char *)local_178,local_268);
      ppcStack_290 = (char **)0x104948;
      concat(local_268,"-m",local_268);
      ppcStack_290 = (char **)0x10496e;
      sprintf(local_88,"%d",(ulong)(uint)*n_frame);
      ppcStack_290 = (char **)0x10497c;
      concat(local_268,local_88,local_268);
      ppcStack_290 = (char **)0x10498e;
      concat(local_268,"-i",local_268);
      ppcStack_290 = (char **)0x1049a5;
      sprintf(local_88,"%d",(ulong)(uint)*iter);
      ppcStack_290 = (char **)0x1049b3;
      concat(local_268,local_88,local_268);
      ppcStack_290 = (char **)0x1049c5;
      concat(local_268,"-a",local_268);
      ppcStack_290 = (char **)0x1049d8;
      concat(local_268,(char *)local_1c8,local_268);
      if (*horn == 0) {
        ppcStack_290 = (char **)0x104a02;
        concat(local_268,"-d",local_268);
        pcVar17 = (char *)local_218;
      }
      else {
        pcVar17 = "-h";
      }
      ppcStack_290 = (char **)0x104a1c;
      concat(local_268,pcVar17,local_268);
      if (*sf != 0) {
        ppcStack_290 = (char **)0x104a48;
        concat(local_268,"-f",local_268);
        ppcStack_290 = (char **)0x104a5b;
        concat(local_268,(char *)local_d8,local_268);
      }
      pcVar17 = local_288;
      ppcStack_290 = (char **)0x104a6d;
      concat(local_288,*argv,v_fname);
      ppcStack_290 = (char **)0x104a7f;
      concat(v_fname,".",v_fname);
      ppcStack_290 = (char **)0x104a8e;
      concat(v_fname,argv[3],v_fname);
      ppcStack_290 = (char **)0x104aa0;
      concat(v_fname,"F",v_fname);
      ppcStack_290 = (char **)0x104ab0;
      concat(v_fname,local_268,v_fname);
      if (*histo != 0) {
        ppcStack_290 = (char **)0x104acb;
        concat(pcVar17,*argv,h_fname);
        ppcStack_290 = (char **)0x104add;
        concat(h_fname,".",h_fname);
        ppcStack_290 = (char **)0x104aec;
        concat(h_fname,argv[3],h_fname);
        ppcStack_290 = (char **)0x104afe;
        concat(h_fname,"H",h_fname);
        ppcStack_290 = (char **)0x104b0e;
        concat(h_fname,local_268,h_fname);
      }
      ppcStack_290 = (char **)0x104b1f;
      printf(" Generated velocity filename  : %s\n",v_fname);
      ppcStack_290 = (char **)0x104b30;
      printf(" Generated histogram filename : %s\n",h_fname);
      ppcStack_290 = (char **)0x104b41;
      printf(" Input stem name              : %s\n",i_fname);
      ppcStack_290 = (char **)0x104b57;
      printf(" Correct velocity filename    : %s\n",c_fname);
      ppcStack_290 = (char **)0x104b66;
      fflush(_stdout);
      return;
    }
  }
  else {
    ppcStack_290 = (char **)0x104b96;
    valid_option_cold_1();
    uVar12 = (uint)out_path;
    pcVar16 = (char *)argv;
    argv = unaff_R14;
  }
  ppcStack_290 = (char **)0x104b9b;
  valid_option_cold_13();
LAB_00104b9b:
  ppcStack_290 = (char **)0x104ba0;
  valid_option_cold_8();
LAB_00104ba0:
  ppcStack_290 = (char **)0x104ba5;
  valid_option_cold_7();
LAB_00104ba5:
  ppcStack_290 = (char **)0x104baa;
  valid_option_cold_6();
LAB_00104baa:
  ppcStack_290 = (char **)0x104baf;
  valid_option_cold_5();
LAB_00104baf:
  ppcStack_290 = (char **)0x104bb4;
  valid_option_cold_2();
LAB_00104bb4:
  ppcStack_290 = (char **)0x104bb9;
  valid_option_cold_3();
LAB_00104bb9:
  ppcStack_290 = (char **)prod_histo;
  valid_option_cold_4();
  ppcStack_290 = unaff_RBP;
  piStack_298 = (int *)unaff_R15;
  ppcStack_2a0 = argv;
  piStack_2a8 = (int *)unaff_R13;
  uStack_2b0 = (ulong)(uint)argc;
  pfStack_2b8 = unaff_RBX;
  pfStack_c30 = local_280;
  iVar5 = *(int *)pcVar17;
  uVar13 = *(ulong *)((long)pcVar17 + 4);
  uVar14 = *(uint *)((long)pcVar17 + 0xc);
  uVar21 = (ulong)uVar14;
  pcStack_c88 = (code *)0x104c10;
  ppcStack_c80 = (char **)pcVar16;
  uStack_c78 = extraout_XMM0_Qa;
  pfStack_c60 = sigma2;
  pfStack_c40 = sigma1;
  ptStack_c28 = extraout_RDX;
  ptVar6 = (qnode_ptr_t)malloc(0x170);
  ptVar6->res = iVar5;
  ptVar6->sizx = (int)uVar13;
  ptVar6->sizy = (int)(uVar13 >> 0x20);
  ptVar6->sizz = uVar14;
  ptVar6->ofst = 0;
  ptVar6->level = 0;
  pcStack_c88 = (code *)0x104c35;
  lStack_c38 = (long)iVar5;
  padStack_c50 = (disp_field512_t *)malloc(0xc3080);
  ptVar6->flow_ptr = padStack_c50;
  pcStack_c88 = (code *)0x104c4d;
  load_velocity(ptVar6,(char *)ppcStack_c80);
  fStack_c68 = (float)(int)uVar12;
  uVar20 = 0;
  pcStack_c88 = (code *)0x104c72;
  memset(afStack_770,0,0x4b0);
  pcStack_c88 = (code *)0x104c83;
  memset(afStack_c20,0,0x4b0);
  fStack_c44 = (float)uStack_c78;
  fVar24 = fStack_c68 * fStack_c44;
  *pfStack_c40 = 0.0;
  *pfStack_c60 = 0.0;
  ppcStack_c80 = (char **)CONCAT44(ppcStack_c80._4_4_,fVar24);
  dStack_c70 = (double)(ulong)uVar12;
  if (KERNEL_Y + 9 < (*(int *)((long)pcVar17 + 8) - KERNEL_Y) + -9) {
    fStack_c64 = (float)(uVar12 - 1);
    lVar15 = (long)KERNEL_Y + 9;
    uStack_c78 = (double)((ulong)uStack_c78._4_4_ << 0x20);
    uVar20 = 0;
    uVar21 = 0;
    do {
      if (KERNEL_X + 9 < (*(int *)((long)pcVar17 + 4) - KERNEL_X) + -9) {
        uStack_c58 = lVar15 * lStack_c38;
        lVar19 = (long)KERNEL_X + 9;
        do {
          lVar7 = *(int *)pcVar17 * lVar15 + lVar19;
          lVar8 = *(long *)((long)pcVar17 + 0x158);
          fVar22 = *(float *)(lVar8 + lVar7 * 8);
          if (((fVar22 != -100.0) || (NAN(fVar22))) &&
             ((fVar22 = *(float *)(lVar8 + 4 + lVar7 * 8), fVar22 != 100.0 || (NAN(fVar22))))) {
            fVar24 = (float)(int)((*(float *)(*(long *)((long)pcVar17 +
                                                       ((long)(*(int *)((long)pcVar17 + 0xc) / 2) *
                                                        2 + 0x2e) * 4) + 0x18 + lVar7 * 0x20) /
                                  fVar24) * fStack_c68);
            pcStack_c88 = (code *)0x104daf;
            fVar22 = psi_error(*(disp_vect_t *)(lVar8 + lVar7 * 8),
                               (*padStack_c50)[uStack_c58 + lVar19]);
            uStack_c78 = (double)CONCAT44(uStack_c78._4_4_,(float)uStack_c78 + fVar22);
            uVar21 = (ulong)((int)uVar21 + 1);
            if (dStack_c70._0_4_ <= (int)fVar24) {
              fVar24 = fStack_c64;
            }
            uVar13 = (ulong)(uint)fVar24;
            lVar8 = (long)(int)fVar24;
            afStack_770[lVar8 * 3 + 1] = afStack_770[lVar8 * 3 + 1] + fVar22;
            aiStack_768[lVar8 * 3] = aiStack_768[lVar8 * 3] + 1;
            if (-1 < (int)fVar24) {
              lVar8 = 0;
              do {
                *(float *)((long)afStack_c20 + lVar8 + 4) =
                     *(float *)((long)afStack_c20 + lVar8 + 4) + fVar22;
                *(int *)((long)aiStack_c18 + lVar8) = *(int *)((long)aiStack_c18 + lVar8) + 1;
                lVar8 = lVar8 + 0xc;
              } while (uVar13 * 0xc + 0xc != lVar8);
            }
            fVar24 = ppcStack_c80._0_4_;
          }
          uVar20 = (ulong)((int)uVar20 + 1);
          lVar19 = lVar19 + 1;
        } while (lVar19 < (*(int *)((long)pcVar17 + 4) - KERNEL_X) + -9);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (*(int *)((long)pcVar17 + 8) - KERNEL_Y) + -9);
    fStack_c64 = (float)(int)uVar21;
  }
  else {
    uStack_c78 = (double)((ulong)uStack_c78._4_4_ << 0x20);
    fStack_c64 = 0.0;
  }
  iVar5 = KERNEL_Y;
  fVar24 = 0.0;
  if ((int)uVar20 != 0) {
    fVar24 = fStack_c64 / (float)(int)uVar20;
  }
  *pfStack_c30 = fVar24;
  fVar24 = (float)uStack_c78 / fStack_c64;
  uStack_c78 = (double)CONCAT44(uStack_c78._4_4_,fVar24);
  *pfStack_c40 = fVar24;
  uStack_c58 = (ulong)dStack_c70 & 0xffffffff;
  if (0 < SUB84(dStack_c70,0)) {
    lVar15 = 0;
    do {
      if (*(int *)((long)aiStack_768 + lVar15) != 0) {
        *(float *)((long)afStack_770 + lVar15 + 4) =
             *(float *)((long)afStack_770 + lVar15 + 4) /
             (float)*(int *)((long)aiStack_768 + lVar15);
      }
      if (*(int *)((long)aiStack_c18 + lVar15) != 0) {
        *(float *)((long)afStack_c20 + lVar15 + 4) =
             *(float *)((long)afStack_c20 + lVar15 + 4) /
             (float)*(int *)((long)aiStack_c18 + lVar15);
      }
      lVar15 = lVar15 + 0xc;
    } while (uStack_c58 * 0xc != lVar15);
  }
  if (iVar5 + 9 < (*(int *)((long)pcVar17 + 8) - KERNEL_Y) + -9) {
    uVar12 = SUB84(dStack_c70,0) - 1;
    uVar13 = (ulong)uVar12;
    uVar20 = (ulong)(iVar5 + 9);
    do {
      uVar21 = (ulong)KERNEL_X;
      if (KERNEL_X + 9 < (*(int *)((long)pcVar17 + 4) - KERNEL_X) + -9) {
        lVar15 = uVar20 * lStack_c38;
        uVar21 = uVar21 + 9;
        do {
          lVar8 = (long)*(int *)pcVar17 * uVar20 + uVar21;
          lVar19 = *(long *)((long)pcVar17 + 0x158);
          fVar24 = *(float *)(lVar19 + lVar8 * 8);
          if (((fVar24 != -100.0) || (NAN(fVar24))) &&
             ((fVar24 = *(float *)(lVar19 + 4 + lVar8 * 8), fVar24 != 100.0 || (NAN(fVar24))))) {
            uVar14 = (uint)((*(float *)(*(long *)((long)pcVar17 +
                                                 ((long)(*(int *)((long)pcVar17 + 0xc) / 2) * 2 +
                                                 0x2e) * 4) + 0x18 + lVar8 * 0x20) /
                            ppcStack_c80._0_4_) * fStack_c68);
            pcStack_c88 = (code *)0x10500c;
            fVar24 = psi_error(*(disp_vect_t *)(lVar19 + lVar8 * 8),(*padStack_c50)[uVar21 + lVar15]
                              );
            *pfStack_c60 = *pfStack_c60 +
                           ((float)uStack_c78 - fVar24) * ((float)uStack_c78 - fVar24);
            if (dStack_c70._0_4_ <= (int)uVar14) {
              uVar14 = uVar12;
            }
            lVar19 = (long)(int)uVar14;
            afStack_770[lVar19 * 3] =
                 afStack_770[lVar19 * 3] +
                 (afStack_770[lVar19 * 3 + 1] - fVar24) * (afStack_770[lVar19 * 3 + 1] - fVar24);
            if (-1 < (int)uVar14) {
              lVar19 = 0;
              do {
                fVar22 = *(float *)((long)afStack_c20 + lVar19 + 4) - fVar24;
                *(float *)((long)afStack_c20 + lVar19) =
                     *(float *)((long)afStack_c20 + lVar19) + fVar22 * fVar22;
                lVar19 = lVar19 + 0xc;
              } while ((ulong)uVar14 * 0xc + 0xc != lVar19);
            }
          }
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)((*(int *)((long)pcVar17 + 4) - KERNEL_X) + -9));
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)((*(int *)((long)pcVar17 + 8) - KERNEL_Y) + -9));
  }
  fVar24 = *pfStack_c60 / fStack_c64;
  if (fVar24 < 0.0) {
    pcStack_c88 = (code *)0x105127;
    fVar24 = sqrtf(fVar24);
  }
  else {
    fVar24 = SQRT(fVar24);
  }
  uVar3 = uStack_c58;
  dVar23 = dStack_c70;
  *pfStack_c60 = fVar24;
  iVar5 = SUB84(dStack_c70,0);
  if (0 < iVar5) {
    uVar13 = uStack_c58 * 0xc;
    uVar20 = 0;
    do {
      if (*(int *)((long)aiStack_768 + uVar20) != 0) {
        fVar24 = *(float *)((long)afStack_770 + uVar20) /
                 (float)*(int *)((long)aiStack_768 + uVar20);
        if (fVar24 < 0.0) {
          pcStack_c88 = (code *)0x105186;
          fVar24 = sqrtf(fVar24);
        }
        else {
          fVar24 = SQRT(fVar24);
        }
        *(float *)((long)afStack_770 + uVar20) = fVar24;
      }
      if (*(int *)((long)aiStack_c18 + uVar20) != 0) {
        fVar24 = *(float *)((long)afStack_c20 + uVar20) /
                 (float)*(int *)((long)aiStack_c18 + uVar20);
        if (fVar24 < 0.0) {
          pcStack_c88 = (code *)0x1051be;
          fVar24 = sqrtf(fVar24);
        }
        else {
          fVar24 = SQRT(fVar24);
        }
        *(float *)((long)afStack_c20 + uVar20) = fVar24;
      }
      uVar20 = uVar20 + 0xc;
    } while (uVar13 != uVar20);
  }
  pcVar16 = "w";
  pcStack_c88 = (code *)0x1051e2;
  __stream = fopen((char *)ptStack_c28,"w");
  if (__stream == (FILE *)0x0) {
    pcStack_c88 = write_velocity;
    prod_histo_cold_1();
    pcStack_c88 = (code *)uVar3;
    dStack_ca0 = dVar23;
    ptVar6 = (qnode_ptr_t)0x180;
    uStack_cb0 = uVar13;
    piStack_ca8 = (int *)pcVar17;
    uStack_c98 = uVar20;
    uStack_c90 = uVar21;
    iVar5 = creat((char *)ptStack_c28,0x180);
    if (iVar5 < 1) {
      c = ptStack_c28;
      write_velocity_cold_1();
      iVar5 = ptVar6->ofst;
      iVar10 = ptVar6->sizy - iVar5;
      q = ptVar6;
      iVar4 = iVar5;
      if (iVar5 < iVar10) {
        do {
          for (; iVar5 < ptVar6->sizx - ptVar6->ofst; iVar5 = iVar5 + 1) {
            if (0 < ptVar6->sizz) {
              lVar15 = 0;
              do {
                fVar24 = dx(c,ptVar6,iVar4,iVar5,(int)lVar15);
                (*ptVar6->param_ptr[lVar15])[ptVar6->res * iVar4 + iVar5].fx = fVar24;
                q = ptVar6;
                fVar24 = dy(c,ptVar6,iVar4,iVar5,(int)lVar15);
                (*ptVar6->param_ptr[lVar15])[ptVar6->res * iVar4 + iVar5].fy = fVar24;
                lVar15 = lVar15 + 1;
              } while (lVar15 < ptVar6->sizz);
            }
          }
          iVar4 = iVar4 + 1;
          iVar5 = ptVar6->ofst;
          iVar10 = ptVar6->sizy - iVar5;
        } while (iVar4 < iVar10);
      }
      iVar4 = c->sizz / 2;
      if (iVar5 < iVar10) {
        iVar1 = ptVar6->sizx;
        iStack_d20 = iVar5;
        do {
          if (iVar5 < iVar1 - iVar5) {
            piVar9 = &(*ptVar6->param_ptr[iVar4])
                      [(long)iStack_d20 * (long)ptVar6->res + (long)iVar5].err;
            iVar18 = iVar1 + iVar5 * -2;
            y = iVar5;
            do {
              if (*piVar9 == 0) {
                fVar24 = dt(c,q,iStack_d20,y);
                piVar9[-4] = (int)fVar24;
              }
              y = y + 1;
              piVar9 = piVar9 + 8;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          iStack_d20 = iStack_d20 + 1;
        } while (iStack_d20 != iVar10);
      }
      if ((extraout_EDX == 0) && (iVar10 = ptVar6->ofst, iVar5 < ptVar6->sizy - iVar10)) {
        do {
          if (iVar10 < ptVar6->sizx - ptVar6->ofst) {
            lVar19 = (long)iVar10;
            lVar15 = (long)iVar5;
            do {
              if ((*ptVar6->param_ptr[iVar4])[ptVar6->res * lVar15 + lVar19].err == 0) {
                iVar10 = (int)lVar19;
                fVar24 = dxx(ptVar6,iVar5,iVar10,iVar4);
                (*ptVar6->param_ptr[iVar4])[ptVar6->res * lVar15 + lVar19].fxx = fVar24;
                fVar24 = dyy(ptVar6,iVar5,iVar10,iVar4);
                (*ptVar6->param_ptr[iVar4])[ptVar6->res * lVar15 + lVar19].fyy = fVar24;
                fVar24 = dxy(ptVar6,iVar5,iVar10,iVar4);
                (*ptVar6->param_ptr[iVar4])[ptVar6->res * lVar15 + lVar19].fxy = fVar24;
              }
              lVar19 = lVar19 + 1;
            } while ((int)lVar19 < ptVar6->sizx - ptVar6->ofst);
          }
          iVar5 = iVar5 + 1;
          iVar10 = ptVar6->ofst;
        } while (iVar5 < ptVar6->sizy - iVar10);
      }
      iVar5 = ptVar6->ofst;
      if (iVar5 < ptVar6->sizy - iVar5) {
        iVar10 = iVar5;
        do {
          if (iVar5 < ptVar6->sizx - ptVar6->ofst) {
            lVar15 = (long)iVar5;
            do {
              papVar2 = ptVar6->param_ptr[iVar4];
              lVar19 = (long)ptVar6->res * (long)iVar10 + lVar15;
              if ((*papVar2)[lVar19].err == 0) {
                dVar25 = (double)(*papVar2)[lVar19].fx;
                dVar23 = (double)(*papVar2)[lVar19].fy;
                dVar23 = dVar23 * dVar23 + dVar25 * dVar25;
                if (dVar23 < 0.0) {
                  dVar23 = sqrt(dVar23);
                }
                else {
                  dVar23 = SQRT(dVar23);
                }
                (*ptVar6->param_ptr[iVar4])[(long)ptVar6->res * (long)iVar10 + lVar15].mag =
                     (float)dVar23;
              }
              lVar15 = lVar15 + 1;
            } while ((int)lVar15 < ptVar6->sizx - ptVar6->ofst);
          }
          iVar10 = iVar10 + 1;
          iVar5 = ptVar6->ofst;
        } while (iVar10 < ptVar6->sizy - iVar5);
      }
      return;
    }
    fStack_cb4 = (float)*(int *)((long)pcVar16 + 4);
    fStack_cb8 = (float)*(int *)((long)pcVar16 + 8);
    write(iVar5,&fStack_cb4,4);
    write(iVar5,&fStack_cb8,4);
    fStack_cb4 = (float)(*(int *)((long)pcVar16 + 4) + KERNEL_X * -2 + -0x12);
    fStack_cb8 = (float)(*(int *)((long)pcVar16 + 8) + KERNEL_Y * -2 + -0x12);
    write(iVar5,&fStack_cb4,4);
    write(iVar5,&fStack_cb8,4);
    fStack_cb4 = (float)(KERNEL_X + 9);
    fStack_cb8 = (float)(KERNEL_Y + 9);
    write(iVar5,&fStack_cb4,4);
    write(iVar5,&fStack_cb8,4);
    iStack_cbc = KERNEL_Y + 9;
    if (iStack_cbc < (*(int *)((long)pcVar16 + 8) - KERNEL_Y) + -9) {
      do {
        if (KERNEL_X + 9 < (*(int *)((long)pcVar16 + 4) - KERNEL_X) + -9) {
          lVar15 = (long)KERNEL_X + 9;
          do {
            lVar19 = (long)*(int *)pcVar16 * (long)iStack_cbc + lVar15;
            fStack_cb4 = *(float *)(*(long *)((long)pcVar16 + 0x158) + 4 + lVar19 * 8);
            fStack_cb8 = -*(float *)(*(long *)((long)pcVar16 + 0x158) + lVar19 * 8);
            write(iVar5,&fStack_cb4,4);
            write(iVar5,&fStack_cb8,4);
            lVar15 = lVar15 + 1;
          } while ((int)lVar15 < (*(int *)((long)pcVar16 + 4) - KERNEL_X) + -9);
        }
        iStack_cbc = iStack_cbc + 1;
      } while (iStack_cbc < (*(int *)((long)pcVar16 + 8) - KERNEL_Y) + -9);
    }
    close(iVar5);
    return;
  }
  uStack_c78 = (double)CONCAT44(uStack_c78._4_4_,(float)aiStack_c18[0]);
  pcStack_c88 = (code *)0x105213;
  fprintf(__stream,"%2d\n",2);
  pcStack_c88 = (code *)0x105227;
  fprintf(__stream,"%3d\n",(ulong)dVar23 & 0xffffffff);
  padStack_c50 = (disp_field512_t *)((double)fStack_c44 * -0.5 + (double)ppcStack_c80._0_4_);
  pcStack_c88 = (code *)0x10525b;
  fprintf(__stream,"%5.7f\n");
  fVar24 = ppcStack_c80._0_4_ / fStack_c68;
  ppcStack_c80 = (char **)CONCAT44(ppcStack_c80._4_4_,fVar24);
  if (0 < iVar5) {
    dStack_c70 = (double)fVar24 * 0.5;
    piVar9 = aiStack_768;
    uVar13 = 0;
    do {
      pcStack_c88 = (code *)0x1052db;
      fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
              (double)((float)(int)uVar13 * fVar24) + dStack_c70,(double)(float)piVar9[-1],
              (double)(float)piVar9[-2],(double)((float)*piVar9 / (float)uStack_c78));
      uVar13 = uVar13 + 1;
      piVar9 = piVar9 + 3;
      fVar24 = ppcStack_c80._0_4_;
    } while (uVar3 != uVar13);
  }
  pcStack_c88 = (code *)0x105305;
  fwrite("\n\n\n",3,1,__stream);
  pcStack_c88 = (code *)0x105319;
  fprintf(__stream,"%3d\n",(ulong)dVar23 & 0xffffffff);
  pcStack_c88 = (code *)0x105330;
  fprintf(__stream,"%5.7f\n",padStack_c50);
  if (0 < iVar5) {
    dStack_c70 = (double)ppcStack_c80._0_4_ * 0.5;
    piVar9 = aiStack_c18;
    uVar13 = 0;
    do {
      pcStack_c88 = (code *)0x1053a5;
      fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
              (double)((float)(int)uVar13 * ppcStack_c80._0_4_) + dStack_c70,
              (double)(float)piVar9[-1],(double)(float)piVar9[-2],
              (double)((float)*piVar9 / (float)uStack_c78));
      uVar13 = uVar13 + 1;
      piVar9 = piVar9 + 3;
    } while (uVar3 != uVar13);
  }
  fclose(__stream);
  return;
}

Assistant:

void valid_option(argc,argv,in_path,out_path,sigma1,sigma2,histo,sf,trsh,
             i_fname,v_fname,c_fname,h_fname,nbin,incr,n_frame,alpha,
             delta,iter,binary,row,col,horn,vmag,maxv)
int argc ;
char *argv[] ;
int *nbin, *iter, *n_frame, *histo, *sf, *binary, *row, *col, *horn, *vmag ;
float *incr, *sigma1, *sigma2, *trsh, *alpha, *delta, *maxv ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ int i ;
  string ext, t0, str_sg, str_tg, str_trsh, str_alpha, str_delta ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 28) && (argc >= 4)) {
    *binary = FALSE ;
    *horn = FALSE ;
    *vmag = FALSE ;
    *sf = FALSE ;
    *histo = FALSE ;
    *trsh = 0.0 ;
    *maxv = 0.0 ;
    *sigma1 = DEF_S1 ;
    strcpy(str_sg,"3.0") ;
    *sigma2 = DEF_S2 ;
    strcpy(str_tg,"1.5") ;
    *iter = RELAXITER ;
    *alpha = ALPHA ;
    strcpy(str_alpha,"5.0") ;
    *delta = DELTA ;
    strcpy(str_delta,"1.0") ;
    *n_frame = 0 ;
    *nbin = 0 ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-A",argv[i]) == 0) {
      if (i + 1 < argc) {
        sscanf(argv[i+1],"%f",alpha) ;
        strcpy(str_alpha,argv[i+1]) ;
        i += 2 ;
      }
      else {
        error(1) ;
      }
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          *sf = TRUE ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-I",argv[i]) == 0) {
            if (i + 1 < argc) {
              sscanf(argv[i+1],"%d",iter) ;
              i += 2 ;
            }
            else {
              error(1) ;
            }
          }
          else {
            if (strcmp("-SG", argv[i]) == 0) {
              if (i + 1 < argc) {
                sscanf(argv[i+1],"%f",sigma1) ;
                strcpy(str_sg,argv[i+1]) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-TG",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%f",sigma2) ;
                  strcpy(str_tg,argv[i+1]) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-M",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",n_frame) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-B",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",col) ;
                      sscanf(argv[i+2],"%d",row) ;
                      *binary = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-H",argv[i]) == 0) {
                      *horn = TRUE ;
                      i++ ;
                    }
                    else {
                      if (strcmp("-D",argv[i]) == 0) {
                        if (i + 1 < argc) {
                          sscanf(argv[i+1],"%f",delta) ;
                          strcpy(str_delta,argv[i+1]) ;
                          i += 2 ;
                        }
                        else {
                          error(1) ;
                        }
                      }
                      else {
                        if (strcmp("-V",argv[i]) == 0) {
                          if (i + 1 < argc) {
                            *vmag = TRUE ;
                            sscanf(argv[i+1],"%f",maxv) ;
                            i += 2 ;
                          }
                          else {
                            error(1) ;
                          }
                        }
                        else {
                          error(2) ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(15) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;
  concat(in_path,argv[3],i_fname) ;
  strcpy(ext,"-sg") ;
  concat(ext,str_sg,ext) ;
  concat(ext,"-tg",ext) ;
  concat(ext,str_tg,ext) ;
  concat(ext,"-m",ext) ;
  sprintf(t0,"%d",*n_frame);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  concat(ext,"-a",ext) ;
  concat(ext,str_alpha,ext) ;
  if (!(*horn)) {
    concat(ext,"-d",ext) ;
    concat(ext,str_delta,ext) ;
  }
  if (*horn) {
    concat(ext,"-h",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}